

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalAig.c
# Opt level: O1

int Gia_ManBalanceGate(Gia_Man_t *pNew,Gia_Obj_t *pObj,Vec_Int_t *vSuper,int *pLits,int nLits)

{
  Vec_Int_t *p;
  int *piVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  
  uVar3 = (uint)*(undefined8 *)pObj;
  if (((-1 < (int)uVar3) && (uVar3 = uVar3 & 0x1fffffff, uVar3 != 0x1fffffff)) &&
     (uVar3 == ((uint)((ulong)*(undefined8 *)pObj >> 0x20) & 0x1fffffff))) {
    __assert_fail("!Gia_ObjIsBuf(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaBalAig.c"
                  ,0x11f,"int Gia_ManBalanceGate(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *, int *, int)"
                 );
  }
  vSuper->nSize = 0;
  if (nLits == 2) {
    Vec_IntPush(vSuper,*pLits);
    Vec_IntPush(vSuper,pLits[1]);
    Gia_ManCreateGate(pNew,pObj,vSuper);
  }
  else if (nLits == 1) {
    Vec_IntPush(vSuper,*pLits);
  }
  else if (2 < nLits) {
    uVar4 = 0;
    do {
      if (pLits[uVar4] < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x12f,"int Abc_Lit2Var(int)");
      }
      uVar3 = (uint)pLits[uVar4] >> 1;
      p = pNew->vLevels;
      Vec_IntFillExtra(p,uVar3 + 1,0);
      if (p->nSize <= (int)uVar3) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      Vec_IntPush(vSuper,p->pArray[uVar3]);
      uVar4 = uVar4 + 1;
    } while ((uint)nLits != uVar4);
    uVar3 = nLits * 4;
    if (SBORROW4(vSuper->nCap,uVar3) != vSuper->nCap + nLits * -4 < 0) {
      if (vSuper->pArray == (int *)0x0) {
        piVar1 = (int *)malloc((ulong)uVar3 << 2);
      }
      else {
        piVar1 = (int *)realloc(vSuper->pArray,(ulong)uVar3 << 2);
      }
      vSuper->pArray = piVar1;
      if (piVar1 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      vSuper->nCap = uVar3;
    }
    piVar1 = vSuper->pArray;
    Abc_QuickSortCostData(piVar1,nLits,1,(word *)(piVar1 + (uint)(nLits * 2)),piVar1 + (uint)nLits);
    uVar4 = 1;
    if (1 < nLits) {
      uVar4 = (ulong)(uint)nLits;
    }
    uVar2 = 0;
    do {
      if ((long)vSuper->nSize <= (long)uVar2) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      vSuper->pArray[uVar2] = pLits[(piVar1 + (uint)nLits)[uVar2]];
      uVar2 = uVar2 + 1;
    } while (uVar4 != uVar2);
    if (vSuper->nSize < nLits) {
      __assert_fail("p->nSize >= nSizeNew",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
    }
    vSuper->nSize = nLits;
    do {
      uVar3 = (uint)*(undefined8 *)pObj;
      if (((~uVar3 & 0x1fffffff) == 0 || (int)uVar3 < 0) ||
         (((uint)((ulong)*(undefined8 *)pObj >> 0x20) & 0x1fffffff) <= (uVar3 & 0x1fffffff))) {
        Gia_ManPrepareLastTwo(pNew,vSuper);
      }
      Gia_ManCreateGate(pNew,pObj,vSuper);
    } while (1 < vSuper->nSize);
  }
  if (vSuper->nSize == 1) {
    return *vSuper->pArray;
  }
  __assert_fail("Vec_IntSize(vSuper) == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaBalAig.c"
                ,0x146,"int Gia_ManBalanceGate(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *, int *, int)");
}

Assistant:

int Gia_ManBalanceGate( Gia_Man_t * pNew, Gia_Obj_t * pObj, Vec_Int_t * vSuper, int * pLits, int nLits )
{
    assert( !Gia_ObjIsBuf(pObj) );
    Vec_IntClear( vSuper );
    if ( nLits == 1 )
        Vec_IntPush( vSuper, pLits[0] );
    else if ( nLits == 2 )
    {
        Vec_IntPush( vSuper, pLits[0] );
        Vec_IntPush( vSuper, pLits[1] );
        Gia_ManCreateGate( pNew, pObj, vSuper );
    }
    else if ( nLits > 2 )
    {
        // collect levels
        int i, * pArray, * pPerm; //int iLit;
        for ( i = 0; i < nLits; i++ )
            Vec_IntPush( vSuper, Gia_ObjLevelId(pNew, Abc_Lit2Var(pLits[i])) );
        // sort by level
        Vec_IntGrow( vSuper, 4 * nLits );        
        pArray = Vec_IntArray( vSuper );
        pPerm = pArray + nLits;
        Abc_QuickSortCostData( pArray, nLits, 1, (word *)(pArray + 2 * nLits), pPerm );
        // collect in the increasing order of level
        for ( i = 0; i < nLits; i++ )
            Vec_IntWriteEntry( vSuper, i, pLits[pPerm[i]] );
        Vec_IntShrink( vSuper, nLits );
/*            
        Vec_IntForEachEntry( vSuper, iLit, i )
            printf( "%d ", Gia_ObjLevel(pNew, Gia_ManObj( pNew, Abc_Lit2Var(iLit) )) );
        printf( "\n" );
*/
        // perform incremental extraction
        while ( Vec_IntSize(vSuper) > 1 )
        {
            if ( !Gia_ObjIsXor(pObj) )
                Gia_ManPrepareLastTwo( pNew, vSuper );
            Gia_ManCreateGate( pNew, pObj, vSuper );
        }
    }
    // consider trivial case
    assert( Vec_IntSize(vSuper) == 1 );
    return Vec_IntEntry(vSuper, 0);
}